

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

QFontEngine *
QFontDatabasePrivate::loadSingleEngine
          (int script,QFontDef *request,QtFontFamily *family,QtFontFoundry *foundry,
          QtFontStyle *style,QtFontSize *size)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  QPlatformIntegration *pQVar4;
  undefined4 extraout_var;
  ulong uVar6;
  QString *pQVar7;
  undefined8 uVar8;
  QFontEngine *pQVar9;
  long in_RDX;
  long in_RSI;
  uint in_EDI;
  int3 *in_R8;
  undefined8 *in_R9;
  long in_FS_OFFSET;
  bool cacheForCommonScript;
  QFontEngine *engine;
  QFontCache *fontCache;
  int pixelSize;
  QPlatformFontDatabase *pfdb;
  QFontDef def;
  QLoggingCategoryMacroHolder<(QtMsgType)4> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)4> qt_category;
  Key key;
  QFontDef *in_stack_fffffffffffffe38;
  QFontDef *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  Script in_stack_fffffffffffffe4c;
  Script SVar10;
  QFontEngine *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 uVar11;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  uint uVar12;
  QFontEngine *local_198;
  undefined4 in_stack_fffffffffffffe78;
  QFontEngine *local_148;
  char local_140 [32];
  char local_120 [32];
  undefined1 local_100 [88];
  double local_a8;
  ulong local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 local_78 [104];
  undefined1 local_10;
  long local_8;
  long *plVar5;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = QGuiApplicationPrivate::platformIntegration();
  iVar2 = (*pQVar4->_vptr_QPlatformIntegration[0xd])();
  plVar5 = (long *)CONCAT44(extraout_var,iVar2);
  uVar3 = (uint)*(ushort *)(in_R9 + 1);
  if ((uVar3 == 0) ||
     ((((*(uint *)(in_R8 + 1) >> 1 & 1) != 0 && (uVar3 == 0xffff)) ||
      (uVar6 = (**(code **)(*plVar5 + 0x80))(), (uVar6 & 1) != 0)))) {
    uVar3 = (uint)*(double *)(in_RSI + 0x58);
  }
  memcpy(local_100,&DAT_00bca830,0x68);
  QFontDef::QFontDef(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_a8 = (double)(int)uVar3;
  QFontCache::instance();
  memcpy(local_78,&DAT_00bca898,0x70);
  QFontCache::Key::Key
            ((Key *)in_stack_fffffffffffffe50,
             (QFontDef *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
             (uchar)((ulong)in_stack_fffffffffffffe40 >> 0x38),
             SUB81((ulong)in_stack_fffffffffffffe40 >> 0x30,0));
  local_198 = QFontCache::findEngine
                        ((QFontCache *)in_stack_fffffffffffffe50,
                         (Key *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  if (local_198 == (QFontEngine *)0x0) {
    uVar11 = false;
    if (in_EDI != 2) {
      uVar11 = (*(byte *)(in_RDX + 0x49) & 1) != 0;
    }
    uVar12 = CONCAT13(uVar11,(int3)in_stack_fffffffffffffe64);
    if (((bool)uVar11 != false) && ((int)in_EDI < 0xab)) {
      local_10 = 2;
      local_148 = QFontCache::findEngine
                            ((QFontCache *)in_stack_fffffffffffffe50,
                             (Key *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      local_10 = (undefined1)in_EDI;
      if (local_148 != (QFontEngine *)0x0) {
        bVar1 = QFontEngine::supportsScript(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_148->isSmoothlyScalable = (bool)((byte)(*(uint *)(in_R8 + 1) >> 1) & 1);
          QFontCache::insertEngine
                    ((QFontCache *)CONCAT44(uVar12,in_stack_fffffffffffffe60),
                     (Key *)CONCAT17(uVar11,in_stack_fffffffffffffe58),
                     (QFontEngine *)CONCAT44(uVar3,in_stack_fffffffffffffe78),
                     SUB81((ulong)in_stack_fffffffffffffe50 >> 0x38,0));
        }
        else {
          local_88 = &DAT_aaaaaaaaaaaaaaaa;
          local_80 = &DAT_aaaaaaaaaaaaaaaa;
          QtPrivateLogging::lcFontDb();
          anon_unknown.dwarf_10ff5f8::QLoggingCategoryMacroHolder<(QtMsgType)4>::
          QLoggingCategoryMacroHolder
                    ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)in_stack_fffffffffffffe40,
                     (QLoggingCategory *)in_stack_fffffffffffffe38);
          while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                   ((QLoggingCategoryMacroHolder *)&local_88), bVar1) {
            anon_unknown.dwarf_10ff5f8::QLoggingCategoryMacroHolder<(QtMsgType)4>::name
                      ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)0x73eb50);
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_fffffffffffffe50,
                       (char *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                       (int)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                       (char *)in_stack_fffffffffffffe38,(char *)0x73eb69);
            pQVar7 = QList<QString>::constFirst(&in_stack_fffffffffffffe40->families);
            QtPrivate::asString(pQVar7);
            uVar8 = QString::utf16();
            QMessageLogger::info
                      (local_120,"OpenType support missing for \"%ls\", script %d",uVar8,
                       (ulong)in_EDI);
            local_80 = (undefined1 *)((ulong)local_80 & 0xffffffffffffff00);
          }
          local_148 = (QFontEngine *)0x0;
        }
        goto LAB_0073ef14;
      }
    }
    if (((*in_R8 >> 0xc == 0) || ((*(ulong *)(in_RSI + 0x60) >> 0x10 & 0xfff) == 0)) ||
       ((bVar1 = QString::isEmpty((QString *)0x73ec5f), !bVar1 &&
        (bVar1 = ::operator!=((QString *)in_stack_fffffffffffffe40,
                              (QString *)in_stack_fffffffffffffe38), !bVar1)))) {
      if ((*(ulong *)(in_RSI + 0x60) >> 0x10 & 0xfff) == 0) {
        local_a0 = local_a0 & 0xfffffffff000ffff | 0x640000;
      }
    }
    else {
      local_a0 = local_a0 & 0xfffffffff000ffff |
                 ((long)(int)((*(ushort *)(in_RSI + 0x62) & 0xfff) * 100 +
                             (((int)*in_R8 >> 0xc) - ((int)*(char *)((long)in_R8 + 2) >> 0x1f) >> 1)
                             ) / (long)((int)*in_R8 >> 0xc) & 0xfffU) << 0x10;
    }
    local_198 = (QFontEngine *)(**(code **)(*plVar5 + 0x40))(plVar5,local_100,*in_R9);
    if (local_198 != (QFontEngine *)0x0) {
      if (((int)in_EDI < 0xab) &&
         (bVar1 = QFontEngine::supportsScript(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c),
         !bVar1)) {
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        local_90 = &DAT_aaaaaaaaaaaaaaaa;
        QtPrivateLogging::lcFontDb();
        anon_unknown.dwarf_10ff5f8::QLoggingCategoryMacroHolder<(QtMsgType)4>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)in_stack_fffffffffffffe40,
                   (QLoggingCategory *)in_stack_fffffffffffffe38);
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_98), bVar1) {
          anon_unknown.dwarf_10ff5f8::QLoggingCategoryMacroHolder<(QtMsgType)4>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)0x73edb8);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffe50,
                     (char *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                     (int)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                     (char *)in_stack_fffffffffffffe38,(char *)0x73edd1);
          pQVar7 = QList<QString>::constFirst(&in_stack_fffffffffffffe40->families);
          QtPrivate::asString(pQVar7);
          uVar8 = QString::utf16();
          QMessageLogger::info
                    (local_140,"OpenType support missing for \"%ls\", script %d",uVar8,(ulong)in_EDI
                    );
          local_90 = (undefined1 *)((ulong)local_90 & 0xffffffffffffff00);
        }
        iVar2 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x73ee23);
        if ((iVar2 == 0) && (local_198 != (QFontEngine *)0x0)) {
          (*local_198->_vptr_QFontEngine[1])();
        }
        local_148 = (QFontEngine *)0x0;
        goto LAB_0073ef14;
      }
      local_198->isSmoothlyScalable = (bool)((byte)(*(uint *)(in_R8 + 1) >> 1) & 1);
      QFontCache::insertEngine
                ((QFontCache *)CONCAT44(uVar12,in_stack_fffffffffffffe60),
                 (Key *)CONCAT17(uVar11,in_stack_fffffffffffffe58),
                 (QFontEngine *)CONCAT44(uVar3,in_stack_fffffffffffffe78),
                 SUB81((ulong)in_stack_fffffffffffffe50 >> 0x38,0));
      SVar10 = in_stack_fffffffffffffe4c & 0xffffff;
      if ((uVar12 & 0x1000000) != 0) {
        SVar10 = CONCAT13(local_198->symbol,(int3)in_stack_fffffffffffffe4c) ^ 0xff000000;
      }
      if ((SVar10 & 0x1000000) != Script_Unknown) {
        local_10 = 2;
        pQVar9 = QFontCache::findEngine
                           ((QFontCache *)in_stack_fffffffffffffe50,
                            (Key *)CONCAT44(SVar10,in_stack_fffffffffffffe48));
        if (pQVar9 == (QFontEngine *)0x0) {
          QFontCache::insertEngine
                    ((QFontCache *)CONCAT44(uVar12,in_stack_fffffffffffffe60),
                     (Key *)CONCAT17(uVar11,in_stack_fffffffffffffe58),
                     (QFontEngine *)CONCAT44(uVar3,in_stack_fffffffffffffe78),
                     SUB81((ulong)in_stack_fffffffffffffe50 >> 0x38,0));
        }
      }
    }
  }
  local_148 = local_198;
LAB_0073ef14:
  QFontCache::Key::~Key((Key *)0x73ef21);
  QFontDef::~QFontDef(in_stack_fffffffffffffe40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_148;
}

Assistant:

QFontEngine *QFontDatabasePrivate::loadSingleEngine(int script,
                              const QFontDef &request,
                              QtFontFamily *family, QtFontFoundry *foundry,
                              QtFontStyle *style, QtFontSize *size)
{
    Q_UNUSED(foundry);

    Q_ASSERT(size);
    QPlatformFontDatabase *pfdb = QGuiApplicationPrivate::platformIntegration()->fontDatabase();
    int pixelSize = size->pixelSize;
    if (!pixelSize || (style->smoothScalable && pixelSize == SMOOTH_SCALABLE)
        || pfdb->fontsAlwaysScalable()) {
        pixelSize = request.pixelSize;
    }

    QFontDef def = request;
    def.pixelSize = pixelSize;

    QFontCache *fontCache = QFontCache::instance();

    QFontCache::Key key(def,script);
    QFontEngine *engine = fontCache->findEngine(key);
    if (!engine) {
        const bool cacheForCommonScript = script != QFontDatabasePrivate::Script_Common
                && (family->writingSystems[QFontDatabase::Latin] & QtFontFamily::Supported) != 0;

        if (Q_LIKELY(cacheForCommonScript) && script < QChar::ScriptCount) {
            // fast path: check if engine was loaded for another script
            key.script = QChar::Script_Common;
            engine = fontCache->findEngine(key);
            key.script = script;
            if (engine) {
                // Also check for OpenType tables when using complex scripts
                if (Q_UNLIKELY(!engine->supportsScript(QChar::Script(script)))) {
                    qCInfo(lcFontDb, "OpenType support missing for \"%ls\", script %d",
                           qUtf16Printable(def.families.constFirst()), script);
                    return nullptr;
                }

                engine->isSmoothlyScalable = style->smoothScalable;
                fontCache->insertEngine(key, engine);
                return engine;
            }
        }

        // To avoid synthesized stretch we need a matching stretch to be 100 after this point.
        // If stretch didn't match exactly we need to calculate the new stretch factor.
        // This only done if not matched by styleName.
        if (style->key.stretch != 0 && request.stretch != 0
            && (request.styleName.isEmpty() || request.styleName != style->styleName)) {
            def.stretch = (request.stretch * 100 + style->key.stretch / 2) / style->key.stretch;
        } else if (request.stretch == QFont::AnyStretch) {
            def.stretch = 100;
        }

        engine = pfdb->fontEngine(def, size->handle);
        if (engine) {
            // Also check for OpenType tables when using complex scripts
            if (script < QChar::ScriptCount && !engine->supportsScript(QChar::Script(script))) {
                qCInfo(lcFontDb, "OpenType support missing for \"%ls\", script %d",
                       qUtf16Printable(def.families.constFirst()), script);
                if (engine->ref.loadRelaxed() == 0)
                    delete engine;
                return nullptr;
            }

            engine->isSmoothlyScalable = style->smoothScalable;
            fontCache->insertEngine(key, engine);

            if (Q_LIKELY(cacheForCommonScript && !engine->symbol)) {
                // cache engine for Common script as well
                key.script = QChar::Script_Common;
                if (!fontCache->findEngine(key))
                    fontCache->insertEngine(key, engine);
            }
        }
    }
    return engine;
}